

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmIfCommand.cxx
# Opt level: O1

bool __thiscall
cmIfFunctionBlocker::Replay
          (cmIfFunctionBlocker *this,
          vector<cmListFileFunction,_std::allocator<cmListFileFunction>_> *functions,
          cmExecutionStatus *inStatus)

{
  bool bVar1;
  cmMakefile *this_00;
  element_type *peVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  cmake *pcVar7;
  int iVar8;
  pointer lff;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  MessageType messType;
  cmExecutionStatus status;
  cmListFileBacktrace elseifBT;
  string errorString;
  string err;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> expandedArguments;
  cmConditionEvaluator conditionEvaluator;
  MessageType local_2f4;
  undefined1 local_2f0 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8;
  undefined8 local_2c8;
  undefined1 local_2c0 [16];
  pointer pbStack_2b0;
  undefined1 local_2a8 [24];
  string local_290;
  pointer *local_270;
  undefined8 local_268;
  undefined1 local_260;
  undefined7 uStack_25f;
  undefined8 uStack_258;
  _Hash_node_base *local_250;
  undefined8 local_248;
  _Hash_node_base local_240;
  undefined8 uStack_238;
  __node_base *local_230;
  undefined8 local_228;
  __node_base local_220;
  undefined8 uStack_218;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_210;
  undefined8 local_208;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_200;
  pointer local_1f0;
  string local_1e8;
  vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_> local_1c8;
  cmListFileBacktrace local_1b0;
  _Storage<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
  local_1a0;
  bool local_180;
  string local_178;
  cmConditionEvaluator local_158;
  _Hash_node_base *local_128;
  undefined8 local_120;
  _Hash_node_base local_118;
  undefined8 uStack_110;
  pointer *local_108;
  undefined8 local_100;
  pointer local_f8;
  undefined8 uStack_f0;
  long local_e8;
  _Alloc_hider *local_e0;
  _Alloc_hider local_d0 [2];
  char local_c0;
  __node_base *local_b8;
  undefined8 local_b0;
  __node_base local_a8;
  undefined8 uStack_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_98;
  undefined8 local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  long local_78;
  long *local_70;
  long local_60 [2];
  char local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  pointer local_38;
  
  lff = (functions->super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>).
        _M_impl.super__Vector_impl_data._M_start;
  local_1f0 = (functions->
              super__Vector_base<cmListFileFunction,_std::allocator<cmListFileFunction>_>)._M_impl.
              super__Vector_impl_data._M_finish;
  if (lff != local_1f0) {
    this_00 = inStatus->Makefile;
    iVar8 = 0;
    do {
      __x = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_2c0 + 8);
      iVar5 = std::__cxx11::string::compare
                        ((char *)&((lff->Impl).
                                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->LowerCaseName);
      iVar6 = std::__cxx11::string::compare
                        ((char *)&((lff->Impl).
                                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->LowerCaseName);
      iVar8 = (iVar8 + (uint)(iVar5 == 0)) - (uint)(iVar6 == 0);
      if (iVar8 == 0) {
        iVar5 = std::__cxx11::string::compare
                          ((char *)&((lff->Impl).
                                     super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr)->LowerCaseName);
        if (iVar5 == 0) {
          cmMakefile::GetBacktrace(this_00);
          peVar2 = (lff->Impl).
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          pcVar3 = (peVar2->OriginalName)._M_dataplus._M_p;
          local_230 = &local_220;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_230,pcVar3,pcVar3 + (peVar2->OriginalName)._M_string_length);
          pcVar3 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
          local_210 = &local_200;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_210,pcVar3,
                     pcVar3 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                              _M_string_length);
          local_78 = ((lff->Impl).
                      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->Line;
          local_b8 = &local_a8;
          local_98 = &local_88;
          if (local_230 == &local_220) {
            uStack_a0 = uStack_218;
          }
          else {
            local_b8 = local_230;
          }
          local_a8._M_nxt._1_7_ = local_220._M_nxt._1_7_;
          local_a8._M_nxt._0_1_ = local_220._M_nxt._0_1_;
          local_b0 = local_228;
          local_228 = 0;
          local_220._M_nxt._0_1_ = 0;
          if (local_210 == &local_200) {
            local_88._8_8_ = local_200._8_8_;
          }
          else {
            local_98 = local_210;
          }
          local_88._M_allocated_capacity._1_7_ = local_200._M_allocated_capacity._1_7_;
          local_88._M_local_buf[0] = local_200._M_local_buf[0];
          local_90 = local_208;
          local_208 = 0;
          local_200._M_local_buf[0] = '\0';
          local_50 = '\0';
          local_230 = &local_220;
          local_210 = &local_200;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)&local_158,
                     (cmListFileContext *)local_2f0);
          if ((local_50 == '\x01') && (local_50 = '\0', local_70 != local_60)) {
            operator_delete(local_70,local_60[0] + 1);
          }
          if (local_98 != &local_88) {
            operator_delete(local_98,local_88._M_allocated_capacity + 1);
          }
          if (local_b8 != &local_a8) {
            operator_delete(local_b8,(ulong)((long)&(local_a8._M_nxt)->_M_nxt + 1));
          }
          if (local_210 != &local_200) {
            operator_delete(local_210,
                            CONCAT71(local_200._M_allocated_capacity._1_7_,local_200._M_local_buf[0]
                                    ) + 1);
          }
          if (local_230 != &local_220) {
            operator_delete(local_230,CONCAT71(local_220._M_nxt._1_7_,local_220._M_nxt._0_1_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_);
          }
          bVar4 = this->ElseSeen;
          if (bVar4 == true) {
            pcVar7 = cmMakefile::GetCMakeInstance(this_00);
            local_2f0._0_8_ = local_2f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2f0,"A duplicate ELSE command was found inside an IF block.",
                       "");
            cmake::IssueMessage(pcVar7,FATAL_ERROR,(string *)local_2f0,
                                (cmListFileBacktrace *)&local_158);
            if ((cmMakefile *)local_2f0._0_8_ != (cmMakefile *)(local_2f0 + 0x10)) {
              operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
            }
            cmSystemTools::s_FatalErrorOccurred = true;
          }
          else {
            bVar1 = this->HasRun;
            this->IsBlocking = bVar1;
            this->HasRun = true;
            this->ElseSeen = true;
            if ((bVar1 == false) &&
               (pcVar7 = cmMakefile::GetCMakeInstance(this_00), pcVar7->Trace == true)) {
              cmMakefile::PrintCommandTrace(this_00,lff,(cmListFileBacktrace *)&local_158,Yes);
            }
          }
          if (local_158.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
              TopEntry.
              super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
              ._M_ptr != (element_type *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_158.Backtrace.
                       super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr);
          }
          if (bVar4 != false) {
            return true;
          }
        }
        else {
          iVar5 = std::__cxx11::string::compare
                            ((char *)&((lff->Impl).
                                       super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                      ._M_ptr)->LowerCaseName);
          if (iVar5 != 0) goto LAB_002ed965;
          cmMakefile::GetBacktrace(this_00);
          peVar2 = (lff->Impl).
                   super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr;
          local_250 = &local_240;
          pcVar3 = (peVar2->OriginalName)._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_250,pcVar3,pcVar3 + (peVar2->OriginalName)._M_string_length);
          local_270 = (pointer *)&local_260;
          pcVar3 = (this->super_cmFunctionBlocker).StartingContext.FilePath._M_dataplus._M_p;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_270,pcVar3,
                     pcVar3 + (this->super_cmFunctionBlocker).StartingContext.FilePath.
                              _M_string_length);
          local_e8 = ((lff->Impl).
                      super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr)->Line;
          local_128 = &local_118;
          local_108 = &local_f8;
          if (local_250 == &local_240) {
            uStack_110 = uStack_238;
          }
          else {
            local_128 = local_250;
          }
          local_118._M_nxt._1_7_ = local_240._M_nxt._1_7_;
          local_118._M_nxt._0_1_ = local_240._M_nxt._0_1_;
          local_120 = local_248;
          local_248 = 0;
          local_240._M_nxt._0_1_ = 0;
          if (local_270 == (pointer *)&local_260) {
            uStack_f0 = uStack_258;
          }
          else {
            local_108 = local_270;
          }
          local_f8 = (pointer)CONCAT71(uStack_25f,local_260);
          local_100 = local_268;
          local_268 = 0;
          local_260 = 0;
          local_c0 = '\0';
          local_270 = (pointer *)&local_260;
          local_250 = &local_240;
          cmConstStack<cmListFileContext,_cmListFileBacktrace>::Push
                    ((cmConstStack<cmListFileContext,_cmListFileBacktrace> *)(local_2a8 + 8),
                     (cmListFileContext *)local_2f0);
          if ((local_c0 == '\x01') && (local_c0 = '\0', local_e0 != local_d0)) {
            operator_delete(local_e0,(ulong)(local_d0[0]._M_p + 1));
          }
          if (local_108 != &local_f8) {
            operator_delete(local_108,(ulong)((long)&(local_f8->_M_dataplus)._M_p + 1));
          }
          if (local_128 != &local_118) {
            operator_delete(local_128,(ulong)((long)&(local_118._M_nxt)->_M_nxt + 1));
          }
          if (local_270 != (pointer *)&local_260) {
            operator_delete(local_270,CONCAT71(uStack_25f,local_260) + 1);
          }
          if (local_250 != &local_240) {
            operator_delete(local_250,CONCAT71(local_240._M_nxt._1_7_,local_240._M_nxt._0_1_) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._8_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f0._8_8_);
          }
          if (this->ElseSeen == true) {
            pcVar7 = cmMakefile::GetCMakeInstance(this_00);
            local_2f0._0_8_ = local_2f0 + 0x10;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_2f0,"An ELSEIF command was found after an ELSE command.","");
            cmake::IssueMessage(pcVar7,FATAL_ERROR,(string *)local_2f0,
                                (cmListFileBacktrace *)(local_2a8 + 8));
            if ((cmMakefile *)local_2f0._0_8_ != (cmMakefile *)(local_2f0 + 0x10)) {
              operator_delete((void *)local_2f0._0_8_,(ulong)(local_2f0._16_8_ + 1));
            }
            cmSystemTools::s_FatalErrorOccurred = true;
LAB_002ee419:
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_ ==
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              return true;
            }
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_);
            return true;
          }
          if (this->HasRun == true) {
            this->IsBlocking = true;
          }
          else {
            pcVar7 = cmMakefile::GetCMakeInstance(this_00);
            if (pcVar7->Trace == true) {
              cmMakefile::PrintCommandTrace(this_00,lff,(cmListFileBacktrace *)(local_2a8 + 8),Yes);
            }
            local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
            local_290._M_string_length = 0;
            local_290.field_2._M_local_buf[0] = '\0';
            local_1c8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            local_1c8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            local_1c8.
            super__Vector_base<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            cmMakefile::ExpandArguments
                      (this_00,&((lff->Impl).
                                 super___shared_ptr<const_cmListFileFunction::Implementation,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr)->Arguments,&local_1c8);
            local_1b0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)local_2a8._8_8_;
            local_1b0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                *(_Atomic_word *)(local_2a8._16_8_ + 8) =
                     *(_Atomic_word *)(local_2a8._16_8_ + 8) + 1;
                UNLOCK();
              }
              else {
                *(_Atomic_word *)(local_2a8._16_8_ + 8) =
                     *(_Atomic_word *)(local_2a8._16_8_ + 8) + 1;
              }
            }
            cmConditionEvaluator::cmConditionEvaluator(&local_158,this_00,&local_1b0);
            if (local_1b0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_1b0.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.
                         TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            bVar4 = cmConditionEvaluator::IsTrue(&local_158,&local_1c8,&local_290,&local_2f4);
            if (local_290._M_string_length != 0) {
              cmIfCommandError_abi_cxx11_(&local_178,&local_1c8);
              local_2f0._0_8_ = local_178._M_string_length;
              local_2f0._8_8_ = local_178._M_dataplus._M_p;
              local_2d8._M_allocated_capacity._0_6_ = (undefined6)local_290._M_string_length;
              local_2d8._M_allocated_capacity._6_2_ =
                   (undefined2)(local_290._M_string_length >> 0x30);
              local_2d8._8_6_ = SUB86(local_290._M_dataplus._M_p,0);
              local_2d8._M_local_buf[0xe] = (char)((ulong)local_290._M_dataplus._M_p >> 0x30);
              local_2d8._M_local_buf[0xf] = (char)((ulong)local_290._M_dataplus._M_p >> 0x38);
              local_2c8 = 0;
              views._M_len = 2;
              views._M_array = (iterator)local_2f0;
              local_2f0._16_8_ = &local_178;
              cmCatViews(&local_1e8,views);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_178._M_dataplus._M_p != &local_178.field_2) {
                operator_delete(local_178._M_dataplus._M_p,
                                local_178.field_2._M_allocated_capacity + 1);
              }
              pcVar7 = cmMakefile::GetCMakeInstance(this_00);
              cmake::IssueMessage(pcVar7,local_2f4,&local_1e8,(cmListFileBacktrace *)(local_2a8 + 8)
                                 );
              if (local_2f4 == FATAL_ERROR) {
                cmSystemTools::s_FatalErrorOccurred = true;
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                  operator_delete(local_1e8._M_dataplus._M_p,
                                  local_1e8.field_2._M_allocated_capacity + 1);
                }
                if ((pointer)local_158.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi != (pointer)0x0) {
                  std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            (local_158.Backtrace.
                             super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                             super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount._M_pi);
                }
                std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
                ~vector(&local_1c8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_290._M_dataplus._M_p != &local_290.field_2) {
                  operator_delete(local_290._M_dataplus._M_p,
                                  CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                           local_290.field_2._M_local_buf[0]) + 1);
                }
                goto LAB_002ee419;
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
                operator_delete(local_1e8._M_dataplus._M_p,
                                local_1e8.field_2._M_allocated_capacity + 1);
              }
            }
            if (bVar4) {
              this->IsBlocking = false;
              this->HasRun = true;
            }
            if ((pointer)local_158.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi != (pointer)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        (local_158.Backtrace.
                         super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
                         super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi);
            }
            std::vector<cmExpandedCommandArgument,_std::allocator<cmExpandedCommandArgument>_>::
            ~vector(&local_1c8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_290._M_dataplus._M_p != &local_290.field_2) {
              operator_delete(local_290._M_dataplus._M_p,
                              CONCAT71(local_290.field_2._M_allocated_capacity._1_7_,
                                       local_290.field_2._M_local_buf[0]) + 1);
            }
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2a8._16_8_);
          }
        }
      }
      else {
LAB_002ed965:
        if (this->IsBlocking == false) {
          local_2d8._8_6_ = 0x2e726f727265;
          local_2d8._M_allocated_capacity._0_6_ = 0x776f6e6b6e75;
          local_2d8._M_allocated_capacity._6_2_ = 0x206e;
          local_2f0._16_8_ = (string *)0xe;
          local_2d8._M_local_buf[0xe] = '\0';
          local_2c0[0] = false;
          local_2c0._8_8_ = (pointer)0x0;
          pbStack_2b0 = (pointer)0x0;
          local_2a8._0_8_ = (pointer)0x0;
          local_2c8 = local_2c8 & 0xffffffff00000000;
          local_180 = false;
          local_2f0._0_8_ = this_00;
          local_2f0._8_8_ = &local_2d8;
          cmMakefile::ExecuteCommand
                    (this_00,lff,(cmExecutionStatus *)local_2f0,
                     (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1a0);
          if ((local_180 == true) &&
             (local_180 = false,
             local_1a0._M_value._M_dataplus._M_p != (_Alloc_hider)((long)&local_1a0._M_value + 0x10)
             )) {
            operator_delete((void *)local_1a0._M_value._M_dataplus._M_p,local_1a0._16_8_ + 1);
          }
          if (local_2c8._0_1_ == true) {
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_48,__x);
            local_158.Makefile =
                 (cmMakefile *)
                 (inStatus->Variables).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_158.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)
                      (inStatus->Variables).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish;
            local_158.Backtrace.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (inStatus->Variables).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            (inStatus->Variables).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_48._M_allocated_capacity;
            (inStatus->Variables).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_48._8_8_;
            (inStatus->Variables).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = local_38;
            local_48._M_allocated_capacity = 0;
            local_48._8_8_ = (pointer)0x0;
            local_38 = (pointer)0x0;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_158);
            inStatus->ReturnInvoked = true;
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)&local_48);
LAB_002ee37c:
            std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~vector(__x);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_2f0._8_8_ == &local_2d8) {
              return true;
            }
            operator_delete((void *)local_2f0._8_8_,
                            CONCAT26(local_2d8._M_allocated_capacity._6_2_,
                                     local_2d8._M_allocated_capacity._0_6_) + 1);
            return true;
          }
          if (local_2c8._1_1_ == true) {
            inStatus->BreakInvoked = true;
            goto LAB_002ee37c;
          }
          if (local_2c8._2_1_ == true) {
            inStatus->ContinueInvoked = true;
            goto LAB_002ee37c;
          }
          if ((bool)local_2c0[0] == true) {
            (inStatus->ExitCode).super__Optional_base<int,_true,_true>._M_payload.
            super__Optional_payload_base<int> =
                 (_Optional_payload_base<int>)(local_2c8 >> 0x20 | 0x100000000);
            goto LAB_002ee37c;
          }
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(__x);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._8_8_ != &local_2d8) {
            operator_delete((void *)local_2f0._8_8_,
                            CONCAT26(local_2d8._M_allocated_capacity._6_2_,
                                     local_2d8._M_allocated_capacity._0_6_) + 1);
          }
        }
      }
      lff = lff + 1;
    } while (lff != local_1f0);
  }
  return true;
}

Assistant:

bool cmIfFunctionBlocker::Replay(std::vector<cmListFileFunction> functions,
                                 cmExecutionStatus& inStatus)
{
  cmMakefile& mf = inStatus.GetMakefile();
  // execute the functions for the true parts of the if statement
  int scopeDepth = 0;
  for (cmListFileFunction const& func : functions) {
    // keep track of scope depth
    if (func.LowerCaseName() == "if") {
      scopeDepth++;
    }
    if (func.LowerCaseName() == "endif") {
      scopeDepth--;
    }
    // watch for our state change
    if (scopeDepth == 0 && func.LowerCaseName() == "else") {
      cmListFileBacktrace elseBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });

      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "A duplicate ELSE command was found inside an IF block.", elseBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      this->IsBlocking = this->HasRun;
      this->HasRun = true;
      this->ElseSeen = true;

      // if trace is enabled, print a (trivially) evaluated "else"
      // statement
      if (!this->IsBlocking && mf.GetCMakeInstance()->GetTrace()) {
        mf.PrintCommandTrace(func, elseBT,
                             cmMakefile::CommandMissingFromStack::Yes);
      }
    } else if (scopeDepth == 0 && func.LowerCaseName() == "elseif") {
      cmListFileBacktrace elseifBT = mf.GetBacktrace().Push(
        cmListFileContext{ func.OriginalName(),
                           this->GetStartingContext().FilePath, func.Line() });
      if (this->ElseSeen) {
        mf.GetCMakeInstance()->IssueMessage(
          MessageType::FATAL_ERROR,
          "An ELSEIF command was found after an ELSE command.", elseifBT);
        cmSystemTools::SetFatalErrorOccurred();
        return true;
      }

      if (this->HasRun) {
        this->IsBlocking = true;
      } else {
        // if trace is enabled, print the evaluated "elseif" statement
        if (mf.GetCMakeInstance()->GetTrace()) {
          mf.PrintCommandTrace(func, elseifBT,
                               cmMakefile::CommandMissingFromStack::Yes);
        }

        std::string errorString;

        std::vector<cmExpandedCommandArgument> expandedArguments;
        mf.ExpandArguments(func.Arguments(), expandedArguments);

        MessageType messType;

        cmConditionEvaluator conditionEvaluator(mf, elseifBT);

        bool isTrue =
          conditionEvaluator.IsTrue(expandedArguments, errorString, messType);

        if (!errorString.empty()) {
          std::string err =
            cmStrCat(cmIfCommandError(expandedArguments), errorString);
          mf.GetCMakeInstance()->IssueMessage(messType, err, elseifBT);
          if (messType == MessageType::FATAL_ERROR) {
            cmSystemTools::SetFatalErrorOccurred();
            return true;
          }
        }

        if (isTrue) {
          this->IsBlocking = false;
          this->HasRun = true;
        }
      }
    }

    // should we execute?
    else if (!this->IsBlocking) {
      cmExecutionStatus status(mf);
      mf.ExecuteCommand(func, status);
      if (status.GetReturnInvoked()) {
        inStatus.SetReturnInvoked(status.GetReturnVariables());
        return true;
      }
      if (status.GetBreakInvoked()) {
        inStatus.SetBreakInvoked();
        return true;
      }
      if (status.GetContinueInvoked()) {
        inStatus.SetContinueInvoked();
        return true;
      }
      if (status.HasExitCode()) {
        inStatus.SetExitCode(status.GetExitCode());
        return true;
      }
    }
  }
  return true;
}